

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_3::CreateContextExtCase::executeForSurface
          (CreateContextExtCase *this,EGLConfig config,EGLSurface surface)

{
  ostringstream *poVar1;
  EGLDisplay display;
  TestLog *log;
  bool bVar2;
  bool bVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  GLenum GVar7;
  EGLenum EVar8;
  Library *pLVar9;
  undefined4 extraout_var;
  int *piVar10;
  GLubyte *__s;
  uint major;
  EGLint flags;
  EGLint flags_00;
  EGLint mask;
  EGLint mask_00;
  EGLint flags_01;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  _anonymous_namespace_ *this_00;
  deInt32 contextFlagsGL;
  int local_1c5c;
  deInt32 strategy;
  Library *local_1c38;
  deInt32 contextFlagsGL_1;
  UniqueContext context;
  string version;
  undefined1 local_1bd8 [384];
  Functions gl;
  
  pLVar9 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  (**pLVar9->_vptr_Library)(pLVar9,(ulong)this->m_api);
  dVar4 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
  eglu::checkError(dVar4,"bindAPI(m_api)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                   ,0x3b7);
  local_1c38 = pLVar9;
  glw::Functions::Functions(&gl);
  display = this->m_display;
  iVar5 = (*pLVar9->_vptr_Library[6])
                    (pLVar9,display,config,0,
                     (this->m_attribList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start);
  eglu::UniqueContext::UniqueContext
            (&context,pLVar9,display,(EGLContext)CONCAT44(extraout_var,iVar5));
  dVar4 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
  eglu::checkError(dVar4,"eglCreateContext",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                   ,0x3bd);
  (*pLVar9->_vptr_Library[0x27])(pLVar9,this->m_display,surface,surface,context.m_context);
  dVar4 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
  eglu::checkError(dVar4,"makeCurrent(m_display, surface, surface, *context)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                   ,0x3bf);
  EglTestContext::initGLFunctions
            ((this->super_TestCase).m_eglTestCtx,&gl,
             (ApiType)((this->m_glContextType).super_ApiType.m_bits & 0x3ff));
  piVar10 = (this->m_attribList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar5 = -1;
  local_1c5c = -1;
  this_00 = (_anonymous_namespace_ *)0xffffffff;
  uVar13 = 0xffffffff;
  uVar11 = 0xffffffff;
  uVar12 = 0xffffffff;
  major = 0xffffffff;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                for (; iVar6 = *piVar10, iVar6 == 0x3098; piVar10 = piVar10 + 2) {
                  major = piVar10[1];
                }
                if (iVar6 != 0x30bf) break;
                local_1c5c = piVar10[1];
                piVar10 = piVar10 + 2;
              }
              if (iVar6 != 0x30fb) break;
              iVar5 = piVar10[1];
              piVar10 = piVar10 + 2;
            }
            if (iVar6 != 0x30fc) break;
            this_00 = (_anonymous_namespace_ *)(ulong)(uint)piVar10[1];
            piVar10 = piVar10 + 2;
          }
          if (iVar6 != 0x30fd) break;
          uVar13 = piVar10[1];
          piVar10 = piVar10 + 2;
        }
        if (iVar6 != 0x3138) break;
        uVar12 = piVar10[1];
        piVar10 = piVar10 + 2;
      }
      if (iVar6 != 0x31bd) break;
      uVar11 = piVar10[1];
      piVar10 = piVar10 + 2;
    }
  } while (iVar6 != 0x3038);
  __s = (*gl.getString)(0x1f02);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&version,(char *)__s,(allocator<char> *)&strategy);
  poVar1 = (ostringstream *)(local_1bd8 + 8);
  local_1bd8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"GL_VERSION: \'");
  std::operator<<((ostream *)poVar1,(string *)&version);
  std::operator<<((ostream *)poVar1,"\'");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  if (major == 0xffffffff) {
    major = 1;
  }
  iVar6 = 0;
  if (iVar5 != -1) {
    iVar6 = iVar5;
  }
  if (this->m_api == 0x30a0) {
    bVar2 = checkVersionString(log,&gl,false,major,iVar6);
    if (major == 3) {
      bVar3 = checkVersionQueries(log,&gl,3,iVar6);
      goto LAB_00dd613b;
    }
  }
  else {
    bVar2 = true;
    if ((this->m_api == 0x30a2) &&
       (bVar2 = checkVersionString(log,&gl,true,major,iVar6), 2 < (int)major)) {
      bVar3 = checkVersionQueries(log,&gl,major,iVar6);
LAB_00dd613b:
      bVar2 = (bool)(bVar2 & bVar3);
    }
  }
  if (((((int)this_00 != -1) && (this->m_api == 0x30a2)) &&
      ((3 < (int)major || ((major == 3 && (0 < iVar6)))))) &&
     ((*gl.getIntegerv)(0x821e,&contextFlagsGL), (int)this_00 != contextFlagsGL)) {
    poVar1 = (ostringstream *)(local_1bd8 + 8);
    local_1bd8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Invalid GL_CONTEXT_FLAGS. Expected \'");
    egl::(anonymous_namespace)::eglContextFlagsToString_abi_cxx11_
              ((string *)&strategy,this_00,flags);
    std::operator<<((ostream *)poVar1,(string *)&strategy);
    std::operator<<((ostream *)poVar1,"\' got \'");
    egl::(anonymous_namespace)::eglContextFlagsToString_abi_cxx11_
              ((string *)&contextFlagsGL_1,(_anonymous_namespace_ *)(ulong)(uint)contextFlagsGL,
               flags_00);
    std::operator<<((ostream *)poVar1,(string *)&contextFlagsGL_1);
    std::operator<<((ostream *)poVar1,"\'");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&contextFlagsGL_1);
    std::__cxx11::string::~string((string *)&strategy);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    bVar2 = false;
  }
  if (uVar13 == 0xffffffff) {
    if (this->m_api == 0x30a2) {
      uVar13 = 1;
      goto joined_r0x00dd6272;
    }
  }
  else {
joined_r0x00dd6272:
    if ((2 < (int)major) && ((major != 3 || (1 < iVar6)))) {
      contextFlagsGL = 0;
      (*gl.getIntegerv)(0x9126,&contextFlagsGL);
      GVar7 = (*gl.getError)();
      glu::checkError(GVar7,"glGetIntegerv()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                      ,0x31a);
      if (uVar13 != contextFlagsGL) {
        poVar1 = (ostringstream *)(local_1bd8 + 8);
        local_1bd8._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Invalid GL_CONTEXT_PROFILE_MASK. Expected \'");
        egl::(anonymous_namespace)::eglProfileMaskToString_abi_cxx11_
                  ((string *)&strategy,(_anonymous_namespace_ *)(ulong)uVar13,mask);
        std::operator<<((ostream *)poVar1,(string *)&strategy);
        std::operator<<((ostream *)poVar1,"\' got \'");
        egl::(anonymous_namespace)::eglProfileMaskToString_abi_cxx11_
                  ((string *)&contextFlagsGL_1,(_anonymous_namespace_ *)(ulong)(uint)contextFlagsGL,
                   mask_00);
        std::operator<<((ostream *)poVar1,(string *)&contextFlagsGL_1);
        std::operator<<((ostream *)poVar1,"\'");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&contextFlagsGL_1);
        std::__cxx11::string::~string((string *)&strategy);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        bVar2 = false;
      }
    }
  }
  pLVar9 = local_1c38;
  if ((uVar11 & uVar12) != 0xffffffff) {
    if (uVar11 != 0xffffffff) {
      uVar12 = uVar11;
    }
    strategy = 0;
    (*gl.getIntegerv)(0x8256,&strategy);
    GVar7 = (*gl.getError)();
    glu::checkError(GVar7,"glGetIntegerv()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                    ,0x32c);
    pLVar9 = local_1c38;
    if (strategy == 0x8261 || uVar12 != 0x31be) {
      if (strategy == 0x8252 || uVar12 != 0x31bf) goto LAB_00dd64da;
      poVar1 = (ostringstream *)(local_1bd8 + 8);
      local_1bd8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"glGetIntegerv(GL_RESET_NOTIFICATION_STRATEGY) returned \'")
      ;
      std::ostream::operator<<(poVar1,strategy);
      std::operator<<((ostream *)poVar1,"\', expected \'GL_LOSE_CONTEXT_ON_RESET\'");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      poVar1 = (ostringstream *)(local_1bd8 + 8);
      local_1bd8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"glGetIntegerv(GL_RESET_NOTIFICATION_STRATEGY) returned \'")
      ;
      pLVar9 = local_1c38;
      std::ostream::operator<<(poVar1,strategy);
      std::operator<<((ostream *)poVar1,"\', expected \'GL_NO_RESET_NOTIFICATION\'");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1bd8 + 8));
    bVar2 = false;
  }
LAB_00dd64da:
  if (local_1c5c != 1) goto LAB_00dd6797;
  EVar8 = this->m_api;
  if (EVar8 == 0x30a0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1bd8,"GL_EXT_robustness",(allocator<char> *)&strategy);
    bVar3 = glu::hasExtension(&gl,(ApiType)(iVar6 << 4 | major),(string *)local_1bd8);
    std::__cxx11::string::~string((string *)local_1bd8);
    if (!bVar3) {
      local_1bd8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1bd8 + 8));
      std::operator<<((ostream *)(local_1bd8 + 8),
                      "Created robustness context but it doesn\'t support GL_EXT_robustness.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00dd662d:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1bd8 + 8));
      bVar2 = false;
    }
LAB_00dd6637:
    EVar8 = this->m_api;
  }
  else if (EVar8 == 0x30a2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1bd8,"GL_ARB_robustness",(allocator<char> *)&strategy);
    bVar3 = glu::hasExtension(&gl,(ApiType)(iVar6 << 4 | major | 0x100),(string *)local_1bd8);
    std::__cxx11::string::~string((string *)local_1bd8);
    if (!bVar3) {
      local_1bd8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1bd8 + 8));
      std::operator<<((ostream *)(local_1bd8 + 8),
                      "Created robustness context but it doesn\'t support GL_ARB_robustness.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00dd662d;
    }
    goto LAB_00dd6637;
  }
  if (EVar8 == 0x30a0) {
    (*gl.getBooleanv)(0x90f3,(GLboolean *)&strategy);
    GVar7 = (*gl.getError)();
    glu::checkError(GVar7,"glGetBooleanv()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                    ,0x360);
    if ((char)strategy == '\x01') goto LAB_00dd6797;
    poVar1 = (ostringstream *)(local_1bd8 + 8);
    local_1bd8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Invalid GL_CONTEXT_ROBUST_ACCESS returned by glGetBooleanv(). Got \'");
    std::operator<<((ostream *)poVar1,(char)strategy);
    std::operator<<((ostream *)poVar1,"\' expected GL_TRUE.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if ((EVar8 != 0x30a2) ||
       ((((int)major < 4 && ((major != 3 || (iVar6 < 1)))) ||
        ((*gl.getIntegerv)(0x821e,&contextFlagsGL_1), (contextFlagsGL_1 & 4U) == 0))))
    goto LAB_00dd6797;
    poVar1 = (ostringstream *)(local_1bd8 + 8);
    local_1bd8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Invalid GL_CONTEXT_FLAGS. GL_CONTEXT_FLAG_ROBUST_ACCESS_BIT to be set, got \'")
    ;
    egl::(anonymous_namespace)::eglContextFlagsToString_abi_cxx11_
              ((string *)&strategy,(_anonymous_namespace_ *)(ulong)(uint)contextFlagsGL_1,flags_01);
    std::operator<<((ostream *)poVar1,(string *)&strategy);
    std::operator<<((ostream *)poVar1,"\'");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&strategy);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1bd8 + 8));
  bVar2 = false;
LAB_00dd6797:
  std::__cxx11::string::~string((string *)&version);
  if (bVar2 == false) {
    this->m_isOk = false;
  }
  eglu::UniqueContext::~UniqueContext(&context);
  (*pLVar9->_vptr_Library[0x27])(pLVar9,this->m_display,0,0,0);
  dVar4 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
  eglu::checkError(dVar4,"makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                   ,0x3d3);
  return;
}

Assistant:

void CreateContextExtCase::executeForSurface (EGLConfig config, EGLSurface surface)
{
	const Library&	egl		= m_eglTestCtx.getLibrary();

	EGLU_CHECK_CALL(egl, bindAPI(m_api));

	try
	{
		glw::Functions		gl;
		eglu::UniqueContext	context	(egl, m_display, egl.createContext(m_display, config, EGL_NO_CONTEXT, &m_attribList[0]));
		EGLU_CHECK_MSG(egl, "eglCreateContext");

		EGLU_CHECK_CALL(egl, makeCurrent(m_display, surface, surface, *context));

		m_eglTestCtx.initGLFunctions(&gl, m_glContextType.getAPI());

		if (!validateCurrentContext(gl))
			m_isOk = false;
	}
	catch (const eglu::Error& error)
	{
		if (error.getError() == EGL_BAD_MATCH)
			m_testCtx.getLog() << TestLog::Message << "Context creation failed with error EGL_BAD_CONTEXT. Config doesn't support api version." << TestLog::EndMessage;
		else if (error.getError() == EGL_BAD_CONFIG)
			m_testCtx.getLog() << TestLog::Message << "Context creation failed with error EGL_BAD_MATCH. Context attribute compination not supported." << TestLog::EndMessage;
		else
		{
			m_testCtx.getLog() << TestLog::Message << "Context creation failed with error " << eglu::getErrorStr(error.getError()) << ". Error is not result of unsupported api etc." << TestLog::EndMessage;
			m_isOk = false;
		}
	}

	EGLU_CHECK_CALL(egl, makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
}